

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O0

int r1f5kf_(int *ido,int *l1,double *cc,int *in1,double *ch,int *in2,double *wa1,double *wa2,
           double *wa3,double *wa4)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  int *in_RCX;
  long in_RDX;
  int *in_RSI;
  int *in_RDI;
  long in_R8;
  int *in_R9;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  int idp2;
  double tr12;
  double tr11;
  double ti12;
  double ti11;
  double arg;
  int ic;
  int k;
  int i__;
  int i__2;
  int i__1;
  int ch_offset;
  int ch_dim2;
  int ch_dim1;
  int cc_offset;
  int cc_dim3;
  int cc_dim2;
  int cc_dim1;
  undefined4 local_64;
  undefined4 local_60;
  
  lVar10 = (long)ti11 + -8;
  lVar11 = (long)ti12 + -8;
  lVar12 = (long)tr11 + -8;
  lVar13 = (long)tr12 + -8;
  iVar1 = *in_RCX;
  iVar2 = *in_RDI;
  iVar3 = *in_RSI;
  lVar14 = in_RDX + (long)(iVar1 * (iVar2 * (iVar3 + 1) + 1) + 1) * -8;
  iVar4 = *in_R9;
  iVar5 = *in_RDI;
  lVar15 = in_R8 + (long)(iVar4 * (iVar5 * 6 + 1) + 1) * -8;
  dVar16 = atan(1.0);
  dVar16 = (dVar16 * 8.0) / 5.0;
  dVar17 = cos(dVar16);
  dVar18 = sin(dVar16);
  dVar19 = cos(dVar16 * 2.0);
  dVar16 = sin(dVar16 * 2.0);
  iVar6 = *in_RSI;
  for (local_64 = 1; local_64 <= iVar6; local_64 = local_64 + 1) {
    *(double *)(lVar15 + (long)(((local_64 * 5 + 1) * iVar5 + 1) * iVar4 + 1) * 8) =
         *(double *)(lVar14 + (long)(((local_64 + iVar3) * iVar2 + 1) * iVar1 + 1) * 8) +
         *(double *)(lVar14 + (long)(((local_64 + iVar3 * 5) * iVar2 + 1) * iVar1 + 1) * 8) +
         *(double *)(lVar14 + (long)(((local_64 + iVar3 * 2) * iVar2 + 1) * iVar1 + 1) * 8) +
         *(double *)(lVar14 + (long)(((local_64 + iVar3 * 4) * iVar2 + 1) * iVar1 + 1) * 8) +
         *(double *)(lVar14 + (long)(((local_64 + iVar3 * 3) * iVar2 + 1) * iVar1 + 1) * 8);
    *(double *)(lVar15 + (long)((*in_RDI + (local_64 * 5 + 2) * iVar5) * iVar4 + 1) * 8) =
         dVar19 * (*(double *)
                    (lVar14 + (long)(((local_64 + iVar3 * 4) * iVar2 + 1) * iVar1 + 1) * 8) +
                  *(double *)(lVar14 + (long)(((local_64 + iVar3 * 3) * iVar2 + 1) * iVar1 + 1) * 8)
                  ) +
         dVar17 * (*(double *)
                    (lVar14 + (long)(((local_64 + iVar3 * 5) * iVar2 + 1) * iVar1 + 1) * 8) +
                  *(double *)(lVar14 + (long)(((local_64 + iVar3 * 2) * iVar2 + 1) * iVar1 + 1) * 8)
                  ) + *(double *)(lVar14 + (long)(((local_64 + iVar3) * iVar2 + 1) * iVar1 + 1) * 8)
    ;
    *(double *)(lVar15 + (long)(((local_64 * 5 + 3) * iVar5 + 1) * iVar4 + 1) * 8) =
         dVar18 * (*(double *)
                    (lVar14 + (long)(((local_64 + iVar3 * 5) * iVar2 + 1) * iVar1 + 1) * 8) -
                  *(double *)(lVar14 + (long)(((local_64 + iVar3 * 2) * iVar2 + 1) * iVar1 + 1) * 8)
                  ) +
         dVar16 * (*(double *)
                    (lVar14 + (long)(((local_64 + iVar3 * 4) * iVar2 + 1) * iVar1 + 1) * 8) -
                  *(double *)(lVar14 + (long)(((local_64 + iVar3 * 3) * iVar2 + 1) * iVar1 + 1) * 8)
                  );
    *(double *)(lVar15 + (long)((*in_RDI + (local_64 * 5 + 4) * iVar5) * iVar4 + 1) * 8) =
         dVar17 * (*(double *)
                    (lVar14 + (long)(((local_64 + iVar3 * 4) * iVar2 + 1) * iVar1 + 1) * 8) +
                  *(double *)(lVar14 + (long)(((local_64 + iVar3 * 3) * iVar2 + 1) * iVar1 + 1) * 8)
                  ) +
         dVar19 * (*(double *)
                    (lVar14 + (long)(((local_64 + iVar3 * 5) * iVar2 + 1) * iVar1 + 1) * 8) +
                  *(double *)(lVar14 + (long)(((local_64 + iVar3 * 2) * iVar2 + 1) * iVar1 + 1) * 8)
                  ) + *(double *)(lVar14 + (long)(((local_64 + iVar3) * iVar2 + 1) * iVar1 + 1) * 8)
    ;
    *(double *)(lVar15 + (long)(((local_64 * 5 + 5) * iVar5 + 1) * iVar4 + 1) * 8) =
         dVar16 * (*(double *)
                    (lVar14 + (long)(((local_64 + iVar3 * 5) * iVar2 + 1) * iVar1 + 1) * 8) -
                  *(double *)(lVar14 + (long)(((local_64 + iVar3 * 2) * iVar2 + 1) * iVar1 + 1) * 8)
                  ) +
         -(dVar18 * (*(double *)
                      (lVar14 + (long)(((local_64 + iVar3 * 4) * iVar2 + 1) * iVar1 + 1) * 8) -
                    *(double *)
                     (lVar14 + (long)(((local_64 + iVar3 * 3) * iVar2 + 1) * iVar1 + 1) * 8)));
  }
  if (*in_RDI != 1) {
    iVar6 = *in_RDI;
    iVar7 = *in_RSI;
    for (local_64 = 1; local_64 <= iVar7; local_64 = local_64 + 1) {
      iVar8 = *in_RDI;
      for (local_60 = 3; local_60 <= iVar8; local_60 = local_60 + 2) {
        iVar9 = (iVar6 + 2) - local_60;
        *(double *)(lVar15 + (long)((local_60 + -1 + (local_64 * 5 + 1) * iVar5) * iVar4 + 1) * 8) =
             *(double *)
              (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3) * iVar2) * iVar1 + 1) * 8) +
             *(double *)(lVar13 + (long)(local_60 + -2) * 8) *
             *(double *)
              (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 2) * iVar2) * iVar1 + 1) * 8) +
             *(double *)(lVar13 + (long)(local_60 + -1) * 8) *
             *(double *)
              (lVar14 + (long)((local_60 + (local_64 + iVar3 * 2) * iVar2) * iVar1 + 1) * 8) +
             *(double *)(lVar10 + (long)(local_60 + -2) * 8) *
             *(double *)
              (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 5) * iVar2) * iVar1 + 1) * 8) +
             *(double *)(lVar10 + (long)(local_60 + -1) * 8) *
             *(double *)
              (lVar14 + (long)((local_60 + (local_64 + iVar3 * 5) * iVar2) * iVar1 + 1) * 8) +
             *(double *)(lVar12 + (long)(local_60 + -2) * 8) *
             *(double *)
              (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 3) * iVar2) * iVar1 + 1) * 8) +
             *(double *)(lVar12 + (long)(local_60 + -1) * 8) *
             *(double *)
              (lVar14 + (long)((local_60 + (local_64 + iVar3 * 3) * iVar2) * iVar1 + 1) * 8) +
             *(double *)(lVar11 + (long)(local_60 + -2) * 8) *
             *(double *)
              (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 4) * iVar2) * iVar1 + 1) * 8) +
             *(double *)(lVar11 + (long)(local_60 + -1) * 8) *
             *(double *)
              (lVar14 + (long)((local_60 + (local_64 + iVar3 * 4) * iVar2) * iVar1 + 1) * 8);
        *(double *)(lVar15 + (long)((local_60 + (local_64 * 5 + 1) * iVar5) * iVar4 + 1) * 8) =
             *(double *)(lVar14 + (long)((local_60 + (local_64 + iVar3) * iVar2) * iVar1 + 1) * 8) +
             *(double *)(lVar13 + (long)(local_60 + -2) * 8) *
             *(double *)
              (lVar14 + (long)((local_60 + (local_64 + iVar3 * 2) * iVar2) * iVar1 + 1) * 8) +
             -(*(double *)(lVar13 + (long)(local_60 + -1) * 8) *
              *(double *)
               (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 2) * iVar2) * iVar1 + 1) * 8))
             + *(double *)(lVar10 + (long)(local_60 + -2) * 8) *
               *(double *)
                (lVar14 + (long)((local_60 + (local_64 + iVar3 * 5) * iVar2) * iVar1 + 1) * 8) +
               -(*(double *)(lVar10 + (long)(local_60 + -1) * 8) *
                *(double *)
                 (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 5) * iVar2) * iVar1 + 1) * 8)
                ) + *(double *)(lVar12 + (long)(local_60 + -2) * 8) *
                    *(double *)
                     (lVar14 + (long)((local_60 + (local_64 + iVar3 * 3) * iVar2) * iVar1 + 1) * 8)
                    + -(*(double *)(lVar12 + (long)(local_60 + -1) * 8) *
                       *(double *)
                        (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 3) * iVar2) * iVar1 +
                                        1) * 8)) +
                    *(double *)(lVar11 + (long)(local_60 + -2) * 8) *
                    *(double *)
                     (lVar14 + (long)((local_60 + (local_64 + iVar3 * 4) * iVar2) * iVar1 + 1) * 8)
                    + -(*(double *)(lVar11 + (long)(local_60 + -1) * 8) *
                       *(double *)
                        (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 4) * iVar2) * iVar1 +
                                        1) * 8));
        *(double *)(lVar15 + (long)((local_60 + -1 + (local_64 * 5 + 3) * iVar5) * iVar4 + 1) * 8) =
             dVar16 * ((*(double *)(lVar12 + (long)(local_60 + -2) * 8) *
                        *(double *)
                         (lVar14 + (long)((local_60 + (local_64 + iVar3 * 3) * iVar2) * iVar1 + 1) *
                                   8) +
                       -(*(double *)(lVar12 + (long)(local_60 + -1) * 8) *
                        *(double *)
                         (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 3) * iVar2) * iVar1 +
                                         1) * 8))) -
                      (*(double *)(lVar11 + (long)(local_60 + -2) * 8) *
                       *(double *)
                        (lVar14 + (long)((local_60 + (local_64 + iVar3 * 4) * iVar2) * iVar1 + 1) *
                                  8) +
                      -(*(double *)(lVar11 + (long)(local_60 + -1) * 8) *
                       *(double *)
                        (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 4) * iVar2) * iVar1 +
                                        1) * 8)))) +
             dVar18 * ((*(double *)(lVar13 + (long)(local_60 + -2) * 8) *
                        *(double *)
                         (lVar14 + (long)((local_60 + (local_64 + iVar3 * 2) * iVar2) * iVar1 + 1) *
                                   8) +
                       -(*(double *)(lVar13 + (long)(local_60 + -1) * 8) *
                        *(double *)
                         (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 2) * iVar2) * iVar1 +
                                         1) * 8))) -
                      (*(double *)(lVar10 + (long)(local_60 + -2) * 8) *
                       *(double *)
                        (lVar14 + (long)((local_60 + (local_64 + iVar3 * 5) * iVar2) * iVar1 + 1) *
                                  8) +
                      -(*(double *)(lVar10 + (long)(local_60 + -1) * 8) *
                       *(double *)
                        (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 5) * iVar2) * iVar1 +
                                        1) * 8)))) +
             dVar19 * (*(double *)(lVar11 + (long)(local_60 + -1) * 8) *
                       *(double *)
                        (lVar14 + (long)((local_60 + (local_64 + iVar3 * 4) * iVar2) * iVar1 + 1) *
                                  8) +
                      *(double *)(lVar11 + (long)(local_60 + -2) * 8) *
                      *(double *)
                       (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 4) * iVar2) * iVar1 + 1
                                       ) * 8) +
                      *(double *)(lVar12 + (long)(local_60 + -2) * 8) *
                      *(double *)
                       (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 3) * iVar2) * iVar1 + 1
                                       ) * 8) +
                      *(double *)(lVar12 + (long)(local_60 + -1) * 8) *
                      *(double *)
                       (lVar14 + (long)((local_60 + (local_64 + iVar3 * 3) * iVar2) * iVar1 + 1) * 8
                       )) +
             dVar17 * (*(double *)(lVar10 + (long)(local_60 + -1) * 8) *
                       *(double *)
                        (lVar14 + (long)((local_60 + (local_64 + iVar3 * 5) * iVar2) * iVar1 + 1) *
                                  8) +
                      *(double *)(lVar10 + (long)(local_60 + -2) * 8) *
                      *(double *)
                       (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 5) * iVar2) * iVar1 + 1
                                       ) * 8) +
                      *(double *)(lVar13 + (long)(local_60 + -2) * 8) *
                      *(double *)
                       (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 2) * iVar2) * iVar1 + 1
                                       ) * 8) +
                      *(double *)(lVar13 + (long)(local_60 + -1) * 8) *
                      *(double *)
                       (lVar14 + (long)((local_60 + (local_64 + iVar3 * 2) * iVar2) * iVar1 + 1) * 8
                       )) +
             *(double *)
              (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3) * iVar2) * iVar1 + 1) * 8);
        *(double *)(lVar15 + (long)((iVar9 + -1 + (local_64 * 5 + 2) * iVar5) * iVar4 + 1) * 8) =
             (dVar19 * (*(double *)(lVar11 + (long)(local_60 + -1) * 8) *
                        *(double *)
                         (lVar14 + (long)((local_60 + (local_64 + iVar3 * 4) * iVar2) * iVar1 + 1) *
                                   8) +
                       *(double *)(lVar11 + (long)(local_60 + -2) * 8) *
                       *(double *)
                        (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 4) * iVar2) * iVar1 +
                                        1) * 8) +
                       *(double *)(lVar12 + (long)(local_60 + -2) * 8) *
                       *(double *)
                        (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 3) * iVar2) * iVar1 +
                                        1) * 8) +
                       *(double *)(lVar12 + (long)(local_60 + -1) * 8) *
                       *(double *)
                        (lVar14 + (long)((local_60 + (local_64 + iVar3 * 3) * iVar2) * iVar1 + 1) *
                                  8)) +
             dVar17 * (*(double *)(lVar10 + (long)(local_60 + -1) * 8) *
                       *(double *)
                        (lVar14 + (long)((local_60 + (local_64 + iVar3 * 5) * iVar2) * iVar1 + 1) *
                                  8) +
                      *(double *)(lVar10 + (long)(local_60 + -2) * 8) *
                      *(double *)
                       (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 5) * iVar2) * iVar1 + 1
                                       ) * 8) +
                      *(double *)(lVar13 + (long)(local_60 + -2) * 8) *
                      *(double *)
                       (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 2) * iVar2) * iVar1 + 1
                                       ) * 8) +
                      *(double *)(lVar13 + (long)(local_60 + -1) * 8) *
                      *(double *)
                       (lVar14 + (long)((local_60 + (local_64 + iVar3 * 2) * iVar2) * iVar1 + 1) * 8
                       )) +
             *(double *)
              (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3) * iVar2) * iVar1 + 1) * 8)) -
             (dVar18 * ((*(double *)(lVar13 + (long)(local_60 + -2) * 8) *
                         *(double *)
                          (lVar14 + (long)((local_60 + (local_64 + iVar3 * 2) * iVar2) * iVar1 + 1)
                                    * 8) +
                        -(*(double *)(lVar13 + (long)(local_60 + -1) * 8) *
                         *(double *)
                          (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 2) * iVar2) * iVar1
                                          + 1) * 8))) -
                       (*(double *)(lVar10 + (long)(local_60 + -2) * 8) *
                        *(double *)
                         (lVar14 + (long)((local_60 + (local_64 + iVar3 * 5) * iVar2) * iVar1 + 1) *
                                   8) +
                       -(*(double *)(lVar10 + (long)(local_60 + -1) * 8) *
                        *(double *)
                         (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 5) * iVar2) * iVar1 +
                                         1) * 8)))) +
             dVar16 * ((*(double *)(lVar12 + (long)(local_60 + -2) * 8) *
                        *(double *)
                         (lVar14 + (long)((local_60 + (local_64 + iVar3 * 3) * iVar2) * iVar1 + 1) *
                                   8) +
                       -(*(double *)(lVar12 + (long)(local_60 + -1) * 8) *
                        *(double *)
                         (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 3) * iVar2) * iVar1 +
                                         1) * 8))) -
                      (*(double *)(lVar11 + (long)(local_60 + -2) * 8) *
                       *(double *)
                        (lVar14 + (long)((local_60 + (local_64 + iVar3 * 4) * iVar2) * iVar1 + 1) *
                                  8) +
                      -(*(double *)(lVar11 + (long)(local_60 + -1) * 8) *
                       *(double *)
                        (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 4) * iVar2) * iVar1 +
                                        1) * 8)))));
        *(double *)(lVar15 + (long)((local_60 + (local_64 * 5 + 3) * iVar5) * iVar4 + 1) * 8) =
             dVar19 * (*(double *)(lVar12 + (long)(local_60 + -2) * 8) *
                       *(double *)
                        (lVar14 + (long)((local_60 + (local_64 + iVar3 * 3) * iVar2) * iVar1 + 1) *
                                  8) +
                       -(*(double *)(lVar12 + (long)(local_60 + -1) * 8) *
                        *(double *)
                         (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 3) * iVar2) * iVar1 +
                                         1) * 8)) +
                      *(double *)(lVar11 + (long)(local_60 + -2) * 8) *
                      *(double *)
                       (lVar14 + (long)((local_60 + (local_64 + iVar3 * 4) * iVar2) * iVar1 + 1) * 8
                       ) + -(*(double *)(lVar11 + (long)(local_60 + -1) * 8) *
                            *(double *)
                             (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 4) * iVar2) *
                                              iVar1 + 1) * 8))) +
             dVar17 * (*(double *)(lVar13 + (long)(local_60 + -2) * 8) *
                       *(double *)
                        (lVar14 + (long)((local_60 + (local_64 + iVar3 * 2) * iVar2) * iVar1 + 1) *
                                  8) +
                       -(*(double *)(lVar13 + (long)(local_60 + -1) * 8) *
                        *(double *)
                         (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 2) * iVar2) * iVar1 +
                                         1) * 8)) +
                      *(double *)(lVar10 + (long)(local_60 + -2) * 8) *
                      *(double *)
                       (lVar14 + (long)((local_60 + (local_64 + iVar3 * 5) * iVar2) * iVar1 + 1) * 8
                       ) + -(*(double *)(lVar10 + (long)(local_60 + -1) * 8) *
                            *(double *)
                             (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 5) * iVar2) *
                                              iVar1 + 1) * 8))) +
             *(double *)(lVar14 + (long)((local_60 + (local_64 + iVar3) * iVar2) * iVar1 + 1) * 8) +
             dVar18 * ((*(double *)(lVar10 + (long)(local_60 + -2) * 8) *
                        *(double *)
                         (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 5) * iVar2) * iVar1 +
                                         1) * 8) +
                       *(double *)(lVar10 + (long)(local_60 + -1) * 8) *
                       *(double *)
                        (lVar14 + (long)((local_60 + (local_64 + iVar3 * 5) * iVar2) * iVar1 + 1) *
                                  8)) -
                      (*(double *)(lVar13 + (long)(local_60 + -2) * 8) *
                       *(double *)
                        (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 2) * iVar2) * iVar1 +
                                        1) * 8) +
                      *(double *)(lVar13 + (long)(local_60 + -1) * 8) *
                      *(double *)
                       (lVar14 + (long)((local_60 + (local_64 + iVar3 * 2) * iVar2) * iVar1 + 1) * 8
                       ))) +
             dVar16 * ((*(double *)(lVar11 + (long)(local_60 + -2) * 8) *
                        *(double *)
                         (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 4) * iVar2) * iVar1 +
                                         1) * 8) +
                       *(double *)(lVar11 + (long)(local_60 + -1) * 8) *
                       *(double *)
                        (lVar14 + (long)((local_60 + (local_64 + iVar3 * 4) * iVar2) * iVar1 + 1) *
                                  8)) -
                      (*(double *)(lVar12 + (long)(local_60 + -2) * 8) *
                       *(double *)
                        (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 3) * iVar2) * iVar1 +
                                        1) * 8) +
                      *(double *)(lVar12 + (long)(local_60 + -1) * 8) *
                      *(double *)
                       (lVar14 + (long)((local_60 + (local_64 + iVar3 * 3) * iVar2) * iVar1 + 1) * 8
                       )));
        *(double *)(lVar15 + (long)((iVar9 + (local_64 * 5 + 2) * iVar5) * iVar4 + 1) * 8) =
             (dVar18 * ((*(double *)(lVar10 + (long)(local_60 + -2) * 8) *
                         *(double *)
                          (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 5) * iVar2) * iVar1
                                          + 1) * 8) +
                        *(double *)(lVar10 + (long)(local_60 + -1) * 8) *
                        *(double *)
                         (lVar14 + (long)((local_60 + (local_64 + iVar3 * 5) * iVar2) * iVar1 + 1) *
                                   8)) -
                       (*(double *)(lVar13 + (long)(local_60 + -2) * 8) *
                        *(double *)
                         (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 2) * iVar2) * iVar1 +
                                         1) * 8) +
                       *(double *)(lVar13 + (long)(local_60 + -1) * 8) *
                       *(double *)
                        (lVar14 + (long)((local_60 + (local_64 + iVar3 * 2) * iVar2) * iVar1 + 1) *
                                  8))) +
             dVar16 * ((*(double *)(lVar11 + (long)(local_60 + -2) * 8) *
                        *(double *)
                         (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 4) * iVar2) * iVar1 +
                                         1) * 8) +
                       *(double *)(lVar11 + (long)(local_60 + -1) * 8) *
                       *(double *)
                        (lVar14 + (long)((local_60 + (local_64 + iVar3 * 4) * iVar2) * iVar1 + 1) *
                                  8)) -
                      (*(double *)(lVar12 + (long)(local_60 + -2) * 8) *
                       *(double *)
                        (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 3) * iVar2) * iVar1 +
                                        1) * 8) +
                      *(double *)(lVar12 + (long)(local_60 + -1) * 8) *
                      *(double *)
                       (lVar14 + (long)((local_60 + (local_64 + iVar3 * 3) * iVar2) * iVar1 + 1) * 8
                       )))) -
             (dVar19 * (*(double *)(lVar12 + (long)(local_60 + -2) * 8) *
                        *(double *)
                         (lVar14 + (long)((local_60 + (local_64 + iVar3 * 3) * iVar2) * iVar1 + 1) *
                                   8) +
                        -(*(double *)(lVar12 + (long)(local_60 + -1) * 8) *
                         *(double *)
                          (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 3) * iVar2) * iVar1
                                          + 1) * 8)) +
                       *(double *)(lVar11 + (long)(local_60 + -2) * 8) *
                       *(double *)
                        (lVar14 + (long)((local_60 + (local_64 + iVar3 * 4) * iVar2) * iVar1 + 1) *
                                  8) +
                       -(*(double *)(lVar11 + (long)(local_60 + -1) * 8) *
                        *(double *)
                         (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 4) * iVar2) * iVar1 +
                                         1) * 8))) +
             dVar17 * (*(double *)(lVar13 + (long)(local_60 + -2) * 8) *
                       *(double *)
                        (lVar14 + (long)((local_60 + (local_64 + iVar3 * 2) * iVar2) * iVar1 + 1) *
                                  8) +
                       -(*(double *)(lVar13 + (long)(local_60 + -1) * 8) *
                        *(double *)
                         (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 2) * iVar2) * iVar1 +
                                         1) * 8)) +
                      *(double *)(lVar10 + (long)(local_60 + -2) * 8) *
                      *(double *)
                       (lVar14 + (long)((local_60 + (local_64 + iVar3 * 5) * iVar2) * iVar1 + 1) * 8
                       ) + -(*(double *)(lVar10 + (long)(local_60 + -1) * 8) *
                            *(double *)
                             (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 5) * iVar2) *
                                              iVar1 + 1) * 8))) +
             *(double *)(lVar14 + (long)((local_60 + (local_64 + iVar3) * iVar2) * iVar1 + 1) * 8));
        *(double *)(lVar15 + (long)((local_60 + -1 + (local_64 * 5 + 5) * iVar5) * iVar4 + 1) * 8) =
             dVar17 * (*(double *)(lVar12 + (long)(local_60 + -2) * 8) *
                       *(double *)
                        (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 3) * iVar2) * iVar1 +
                                        1) * 8) +
                       *(double *)(lVar12 + (long)(local_60 + -1) * 8) *
                       *(double *)
                        (lVar14 + (long)((local_60 + (local_64 + iVar3 * 3) * iVar2) * iVar1 + 1) *
                                  8) +
                      *(double *)(lVar11 + (long)(local_60 + -2) * 8) *
                      *(double *)
                       (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 4) * iVar2) * iVar1 + 1
                                       ) * 8) +
                      *(double *)(lVar11 + (long)(local_60 + -1) * 8) *
                      *(double *)
                       (lVar14 + (long)((local_60 + (local_64 + iVar3 * 4) * iVar2) * iVar1 + 1) * 8
                       )) +
             dVar19 * (*(double *)(lVar13 + (long)(local_60 + -2) * 8) *
                       *(double *)
                        (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 2) * iVar2) * iVar1 +
                                        1) * 8) +
                       *(double *)(lVar13 + (long)(local_60 + -1) * 8) *
                       *(double *)
                        (lVar14 + (long)((local_60 + (local_64 + iVar3 * 2) * iVar2) * iVar1 + 1) *
                                  8) +
                      *(double *)(lVar10 + (long)(local_60 + -2) * 8) *
                      *(double *)
                       (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 5) * iVar2) * iVar1 + 1
                                       ) * 8) +
                      *(double *)(lVar10 + (long)(local_60 + -1) * 8) *
                      *(double *)
                       (lVar14 + (long)((local_60 + (local_64 + iVar3 * 5) * iVar2) * iVar1 + 1) * 8
                       )) +
             *(double *)
              (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3) * iVar2) * iVar1 + 1) * 8) +
             dVar16 * ((*(double *)(lVar13 + (long)(local_60 + -2) * 8) *
                        *(double *)
                         (lVar14 + (long)((local_60 + (local_64 + iVar3 * 2) * iVar2) * iVar1 + 1) *
                                   8) +
                       -(*(double *)(lVar13 + (long)(local_60 + -1) * 8) *
                        *(double *)
                         (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 2) * iVar2) * iVar1 +
                                         1) * 8))) -
                      (*(double *)(lVar10 + (long)(local_60 + -2) * 8) *
                       *(double *)
                        (lVar14 + (long)((local_60 + (local_64 + iVar3 * 5) * iVar2) * iVar1 + 1) *
                                  8) +
                      -(*(double *)(lVar10 + (long)(local_60 + -1) * 8) *
                       *(double *)
                        (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 5) * iVar2) * iVar1 +
                                        1) * 8)))) +
             -(dVar18 * ((*(double *)(lVar12 + (long)(local_60 + -2) * 8) *
                          *(double *)
                           (lVar14 + (long)((local_60 + (local_64 + iVar3 * 3) * iVar2) * iVar1 + 1)
                                     * 8) +
                         -(*(double *)(lVar12 + (long)(local_60 + -1) * 8) *
                          *(double *)
                           (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 3) * iVar2) * iVar1
                                           + 1) * 8))) -
                        (*(double *)(lVar11 + (long)(local_60 + -2) * 8) *
                         *(double *)
                          (lVar14 + (long)((local_60 + (local_64 + iVar3 * 4) * iVar2) * iVar1 + 1)
                                    * 8) +
                        -(*(double *)(lVar11 + (long)(local_60 + -1) * 8) *
                         *(double *)
                          (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 4) * iVar2) * iVar1
                                          + 1) * 8)))));
        *(double *)(lVar15 + (long)((iVar9 + -1 + (local_64 * 5 + 4) * iVar5) * iVar4 + 1) * 8) =
             (dVar17 * (*(double *)(lVar12 + (long)(local_60 + -2) * 8) *
                        *(double *)
                         (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 3) * iVar2) * iVar1 +
                                         1) * 8) +
                        *(double *)(lVar12 + (long)(local_60 + -1) * 8) *
                        *(double *)
                         (lVar14 + (long)((local_60 + (local_64 + iVar3 * 3) * iVar2) * iVar1 + 1) *
                                   8) +
                       *(double *)(lVar11 + (long)(local_60 + -2) * 8) *
                       *(double *)
                        (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 4) * iVar2) * iVar1 +
                                        1) * 8) +
                       *(double *)(lVar11 + (long)(local_60 + -1) * 8) *
                       *(double *)
                        (lVar14 + (long)((local_60 + (local_64 + iVar3 * 4) * iVar2) * iVar1 + 1) *
                                  8)) +
             dVar19 * (*(double *)(lVar13 + (long)(local_60 + -2) * 8) *
                       *(double *)
                        (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 2) * iVar2) * iVar1 +
                                        1) * 8) +
                       *(double *)(lVar13 + (long)(local_60 + -1) * 8) *
                       *(double *)
                        (lVar14 + (long)((local_60 + (local_64 + iVar3 * 2) * iVar2) * iVar1 + 1) *
                                  8) +
                      *(double *)(lVar10 + (long)(local_60 + -2) * 8) *
                      *(double *)
                       (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 5) * iVar2) * iVar1 + 1
                                       ) * 8) +
                      *(double *)(lVar10 + (long)(local_60 + -1) * 8) *
                      *(double *)
                       (lVar14 + (long)((local_60 + (local_64 + iVar3 * 5) * iVar2) * iVar1 + 1) * 8
                       )) +
             *(double *)
              (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3) * iVar2) * iVar1 + 1) * 8)) -
             (dVar16 * ((*(double *)(lVar13 + (long)(local_60 + -2) * 8) *
                         *(double *)
                          (lVar14 + (long)((local_60 + (local_64 + iVar3 * 2) * iVar2) * iVar1 + 1)
                                    * 8) +
                        -(*(double *)(lVar13 + (long)(local_60 + -1) * 8) *
                         *(double *)
                          (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 2) * iVar2) * iVar1
                                          + 1) * 8))) -
                       (*(double *)(lVar10 + (long)(local_60 + -2) * 8) *
                        *(double *)
                         (lVar14 + (long)((local_60 + (local_64 + iVar3 * 5) * iVar2) * iVar1 + 1) *
                                   8) +
                       -(*(double *)(lVar10 + (long)(local_60 + -1) * 8) *
                        *(double *)
                         (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 5) * iVar2) * iVar1 +
                                         1) * 8)))) +
             -(dVar18 * ((*(double *)(lVar12 + (long)(local_60 + -2) * 8) *
                          *(double *)
                           (lVar14 + (long)((local_60 + (local_64 + iVar3 * 3) * iVar2) * iVar1 + 1)
                                     * 8) +
                         -(*(double *)(lVar12 + (long)(local_60 + -1) * 8) *
                          *(double *)
                           (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 3) * iVar2) * iVar1
                                           + 1) * 8))) -
                        (*(double *)(lVar11 + (long)(local_60 + -2) * 8) *
                         *(double *)
                          (lVar14 + (long)((local_60 + (local_64 + iVar3 * 4) * iVar2) * iVar1 + 1)
                                    * 8) +
                        -(*(double *)(lVar11 + (long)(local_60 + -1) * 8) *
                         *(double *)
                          (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 4) * iVar2) * iVar1
                                          + 1) * 8))))));
        *(double *)(lVar15 + (long)((local_60 + (local_64 * 5 + 5) * iVar5) * iVar4 + 1) * 8) =
             dVar17 * (*(double *)(lVar12 + (long)(local_60 + -2) * 8) *
                       *(double *)
                        (lVar14 + (long)((local_60 + (local_64 + iVar3 * 3) * iVar2) * iVar1 + 1) *
                                  8) +
                       -(*(double *)(lVar12 + (long)(local_60 + -1) * 8) *
                        *(double *)
                         (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 3) * iVar2) * iVar1 +
                                         1) * 8)) +
                      *(double *)(lVar11 + (long)(local_60 + -2) * 8) *
                      *(double *)
                       (lVar14 + (long)((local_60 + (local_64 + iVar3 * 4) * iVar2) * iVar1 + 1) * 8
                       ) + -(*(double *)(lVar11 + (long)(local_60 + -1) * 8) *
                            *(double *)
                             (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 4) * iVar2) *
                                              iVar1 + 1) * 8))) +
             dVar19 * (*(double *)(lVar13 + (long)(local_60 + -2) * 8) *
                       *(double *)
                        (lVar14 + (long)((local_60 + (local_64 + iVar3 * 2) * iVar2) * iVar1 + 1) *
                                  8) +
                       -(*(double *)(lVar13 + (long)(local_60 + -1) * 8) *
                        *(double *)
                         (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 2) * iVar2) * iVar1 +
                                         1) * 8)) +
                      *(double *)(lVar10 + (long)(local_60 + -2) * 8) *
                      *(double *)
                       (lVar14 + (long)((local_60 + (local_64 + iVar3 * 5) * iVar2) * iVar1 + 1) * 8
                       ) + -(*(double *)(lVar10 + (long)(local_60 + -1) * 8) *
                            *(double *)
                             (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 5) * iVar2) *
                                              iVar1 + 1) * 8))) +
             *(double *)(lVar14 + (long)((local_60 + (local_64 + iVar3) * iVar2) * iVar1 + 1) * 8) +
             dVar16 * ((*(double *)(lVar10 + (long)(local_60 + -2) * 8) *
                        *(double *)
                         (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 5) * iVar2) * iVar1 +
                                         1) * 8) +
                       *(double *)(lVar10 + (long)(local_60 + -1) * 8) *
                       *(double *)
                        (lVar14 + (long)((local_60 + (local_64 + iVar3 * 5) * iVar2) * iVar1 + 1) *
                                  8)) -
                      (*(double *)(lVar13 + (long)(local_60 + -2) * 8) *
                       *(double *)
                        (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 2) * iVar2) * iVar1 +
                                        1) * 8) +
                      *(double *)(lVar13 + (long)(local_60 + -1) * 8) *
                      *(double *)
                       (lVar14 + (long)((local_60 + (local_64 + iVar3 * 2) * iVar2) * iVar1 + 1) * 8
                       ))) +
             -(dVar18 * ((*(double *)(lVar11 + (long)(local_60 + -2) * 8) *
                          *(double *)
                           (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 4) * iVar2) * iVar1
                                           + 1) * 8) +
                         *(double *)(lVar11 + (long)(local_60 + -1) * 8) *
                         *(double *)
                          (lVar14 + (long)((local_60 + (local_64 + iVar3 * 4) * iVar2) * iVar1 + 1)
                                    * 8)) -
                        (*(double *)(lVar12 + (long)(local_60 + -2) * 8) *
                         *(double *)
                          (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 3) * iVar2) * iVar1
                                          + 1) * 8) +
                        *(double *)(lVar12 + (long)(local_60 + -1) * 8) *
                        *(double *)
                         (lVar14 + (long)((local_60 + (local_64 + iVar3 * 3) * iVar2) * iVar1 + 1) *
                                   8))));
        *(double *)(lVar15 + (long)((iVar9 + (local_64 * 5 + 4) * iVar5) * iVar4 + 1) * 8) =
             (dVar16 * ((*(double *)(lVar10 + (long)(local_60 + -2) * 8) *
                         *(double *)
                          (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 5) * iVar2) * iVar1
                                          + 1) * 8) +
                        *(double *)(lVar10 + (long)(local_60 + -1) * 8) *
                        *(double *)
                         (lVar14 + (long)((local_60 + (local_64 + iVar3 * 5) * iVar2) * iVar1 + 1) *
                                   8)) -
                       (*(double *)(lVar13 + (long)(local_60 + -2) * 8) *
                        *(double *)
                         (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 2) * iVar2) * iVar1 +
                                         1) * 8) +
                       *(double *)(lVar13 + (long)(local_60 + -1) * 8) *
                       *(double *)
                        (lVar14 + (long)((local_60 + (local_64 + iVar3 * 2) * iVar2) * iVar1 + 1) *
                                  8))) +
             -(dVar18 * ((*(double *)(lVar11 + (long)(local_60 + -2) * 8) *
                          *(double *)
                           (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 4) * iVar2) * iVar1
                                           + 1) * 8) +
                         *(double *)(lVar11 + (long)(local_60 + -1) * 8) *
                         *(double *)
                          (lVar14 + (long)((local_60 + (local_64 + iVar3 * 4) * iVar2) * iVar1 + 1)
                                    * 8)) -
                        (*(double *)(lVar12 + (long)(local_60 + -2) * 8) *
                         *(double *)
                          (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 3) * iVar2) * iVar1
                                          + 1) * 8) +
                        *(double *)(lVar12 + (long)(local_60 + -1) * 8) *
                        *(double *)
                         (lVar14 + (long)((local_60 + (local_64 + iVar3 * 3) * iVar2) * iVar1 + 1) *
                                   8))))) -
             (dVar17 * (*(double *)(lVar12 + (long)(local_60 + -2) * 8) *
                        *(double *)
                         (lVar14 + (long)((local_60 + (local_64 + iVar3 * 3) * iVar2) * iVar1 + 1) *
                                   8) +
                        -(*(double *)(lVar12 + (long)(local_60 + -1) * 8) *
                         *(double *)
                          (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 3) * iVar2) * iVar1
                                          + 1) * 8)) +
                       *(double *)(lVar11 + (long)(local_60 + -2) * 8) *
                       *(double *)
                        (lVar14 + (long)((local_60 + (local_64 + iVar3 * 4) * iVar2) * iVar1 + 1) *
                                  8) +
                       -(*(double *)(lVar11 + (long)(local_60 + -1) * 8) *
                        *(double *)
                         (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 4) * iVar2) * iVar1 +
                                         1) * 8))) +
             dVar19 * (*(double *)(lVar13 + (long)(local_60 + -2) * 8) *
                       *(double *)
                        (lVar14 + (long)((local_60 + (local_64 + iVar3 * 2) * iVar2) * iVar1 + 1) *
                                  8) +
                       -(*(double *)(lVar13 + (long)(local_60 + -1) * 8) *
                        *(double *)
                         (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 2) * iVar2) * iVar1 +
                                         1) * 8)) +
                      *(double *)(lVar10 + (long)(local_60 + -2) * 8) *
                      *(double *)
                       (lVar14 + (long)((local_60 + (local_64 + iVar3 * 5) * iVar2) * iVar1 + 1) * 8
                       ) + -(*(double *)(lVar10 + (long)(local_60 + -1) * 8) *
                            *(double *)
                             (lVar14 + (long)((local_60 + -1 + (local_64 + iVar3 * 5) * iVar2) *
                                              iVar1 + 1) * 8))) +
             *(double *)(lVar14 + (long)((local_60 + (local_64 + iVar3) * iVar2) * iVar1 + 1) * 8));
      }
    }
  }
  return 0;
}

Assistant:

int r1f5kf_(int *ido, int *l1, fft_real_t *cc, int *
	in1, fft_real_t *ch, int *in2, fft_real_t *wa1, fft_real_t *wa2, fft_real_t *wa3, fft_real_t *
	wa4)
{
    /* System generated locals */
    int cc_dim1, cc_dim2, cc_dim3, cc_offset, ch_dim1, ch_dim2, ch_offset,
	     i__1, i__2;

    /* Builtin functions */

    /* Local variables */
     int i__, k, ic;
     fft_real_t arg, ti11, ti12, tr11, tr12;
     int idp2;


    /* Parameter adjustments */
    --wa4;
    --wa3;
    --wa2;
    --wa1;
    cc_dim1 = *in1;
    cc_dim2 = *ido;
    cc_dim3 = *l1;
    cc_offset = 1 + cc_dim1 * (1 + cc_dim2 * (1 + cc_dim3));
    cc -= cc_offset;
    ch_dim1 = *in2;
    ch_dim2 = *ido;
    ch_offset = 1 + ch_dim1 * (1 + ch_dim2 * 6);
    ch -= ch_offset;

    /* Function Body */
    arg = atan(1.0) * 8.0 / 5.0;
    tr11 = cos(arg);
    ti11 = sin(arg);
    tr12 = cos(arg * 2.0);
    ti12 = sin(arg * 2.0);
    i__1 = *l1;
    for (k = 1; k <= i__1; ++k) {
	ch[((k * 5 + 1) * ch_dim2 + 1) * ch_dim1 + 1] = cc[((k + cc_dim3) *
		cc_dim2 + 1) * cc_dim1 + 1] + (cc[((k + cc_dim3 * 5) *
		cc_dim2 + 1) * cc_dim1 + 1] + cc[((k + (cc_dim3 << 1)) *
		cc_dim2 + 1) * cc_dim1 + 1]) + (cc[((k + (cc_dim3 << 2)) *
		cc_dim2 + 1) * cc_dim1 + 1] + cc[((k + cc_dim3 * 3) * cc_dim2
		+ 1) * cc_dim1 + 1]);
	ch[(*ido + (k * 5 + 2) * ch_dim2) * ch_dim1 + 1] = cc[((k + cc_dim3) *
		 cc_dim2 + 1) * cc_dim1 + 1] + tr11 * (cc[((k + cc_dim3 * 5) *
		 cc_dim2 + 1) * cc_dim1 + 1] + cc[((k + (cc_dim3 << 1)) *
		cc_dim2 + 1) * cc_dim1 + 1]) + tr12 * (cc[((k + (cc_dim3 << 2)
		) * cc_dim2 + 1) * cc_dim1 + 1] + cc[((k + cc_dim3 * 3) *
		cc_dim2 + 1) * cc_dim1 + 1]);
	ch[((k * 5 + 3) * ch_dim2 + 1) * ch_dim1 + 1] = ti11 * (cc[((k +
		cc_dim3 * 5) * cc_dim2 + 1) * cc_dim1 + 1] - cc[((k + (
		cc_dim3 << 1)) * cc_dim2 + 1) * cc_dim1 + 1]) + ti12 * (cc[((
		k + (cc_dim3 << 2)) * cc_dim2 + 1) * cc_dim1 + 1] - cc[((k +
		cc_dim3 * 3) * cc_dim2 + 1) * cc_dim1 + 1]);
	ch[(*ido + (k * 5 + 4) * ch_dim2) * ch_dim1 + 1] = cc[((k + cc_dim3) *
		 cc_dim2 + 1) * cc_dim1 + 1] + tr12 * (cc[((k + cc_dim3 * 5) *
		 cc_dim2 + 1) * cc_dim1 + 1] + cc[((k + (cc_dim3 << 1)) *
		cc_dim2 + 1) * cc_dim1 + 1]) + tr11 * (cc[((k + (cc_dim3 << 2)
		) * cc_dim2 + 1) * cc_dim1 + 1] + cc[((k + cc_dim3 * 3) *
		cc_dim2 + 1) * cc_dim1 + 1]);
	ch[((k * 5 + 5) * ch_dim2 + 1) * ch_dim1 + 1] = ti12 * (cc[((k +
		cc_dim3 * 5) * cc_dim2 + 1) * cc_dim1 + 1] - cc[((k + (
		cc_dim3 << 1)) * cc_dim2 + 1) * cc_dim1 + 1]) - ti11 * (cc[((
		k + (cc_dim3 << 2)) * cc_dim2 + 1) * cc_dim1 + 1] - cc[((k +
		cc_dim3 * 3) * cc_dim2 + 1) * cc_dim1 + 1]);
/* L101: */
    }
    if (*ido == 1) {
	return 0;
    }
    idp2 = *ido + 2;
    i__1 = *l1;
    for (k = 1; k <= i__1; ++k) {
	i__2 = *ido;
	for (i__ = 3; i__ <= i__2; i__ += 2) {
	    ic = idp2 - i__;
	    ch[(i__ - 1 + (k * 5 + 1) * ch_dim2) * ch_dim1 + 1] = cc[(i__ - 1
		    + (k + cc_dim3) * cc_dim2) * cc_dim1 + 1] + (wa1[i__ - 2]
		    * cc[(i__ - 1 + (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1
		    + 1] + wa1[i__ - 1] * cc[(i__ + (k + (cc_dim3 << 1)) *
		    cc_dim2) * cc_dim1 + 1] + (wa4[i__ - 2] * cc[(i__ - 1 + (
		    k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] + wa4[i__ - 1]
		    * cc[(i__ + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1]))
		    + (wa2[i__ - 2] * cc[(i__ - 1 + (k + cc_dim3 * 3) *
		    cc_dim2) * cc_dim1 + 1] + wa2[i__ - 1] * cc[(i__ + (k +
		    cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] + (wa3[i__ - 2] *
		    cc[(i__ - 1 + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 +
		    1] + wa3[i__ - 1] * cc[(i__ + (k + (cc_dim3 << 2)) *
		    cc_dim2) * cc_dim1 + 1]));
	    ch[(i__ + (k * 5 + 1) * ch_dim2) * ch_dim1 + 1] = cc[(i__ + (k +
		    cc_dim3) * cc_dim2) * cc_dim1 + 1] + (wa1[i__ - 2] * cc[(
		    i__ + (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1] -
		    wa1[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) *
		    cc_dim2) * cc_dim1 + 1] + (wa4[i__ - 2] * cc[(i__ + (k +
		    cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] - wa4[i__ - 1] *
		    cc[(i__ - 1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1])
		    ) + (wa2[i__ - 2] * cc[(i__ + (k + cc_dim3 * 3) * cc_dim2)
		     * cc_dim1 + 1] - wa2[i__ - 1] * cc[(i__ - 1 + (k +
		    cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] + (wa3[i__ - 2] *
		    cc[(i__ + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1]
		    - wa3[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 2)) *
		    cc_dim2) * cc_dim1 + 1]));
	    ch[(i__ - 1 + (k * 5 + 3) * ch_dim2) * ch_dim1 + 1] = cc[(i__ - 1
		    + (k + cc_dim3) * cc_dim2) * cc_dim1 + 1] + tr11 * (wa1[
		    i__ - 2] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) * cc_dim2) *
		     cc_dim1 + 1] + wa1[i__ - 1] * cc[(i__ + (k + (cc_dim3 <<
		    1)) * cc_dim2) * cc_dim1 + 1] + wa4[i__ - 2] * cc[(i__ -
		    1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] + wa4[i__
		    - 1] * cc[(i__ + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 +
		    1]) + tr12 * (wa2[i__ - 2] * cc[(i__ - 1 + (k + cc_dim3 *
		    3) * cc_dim2) * cc_dim1 + 1] + wa2[i__ - 1] * cc[(i__ + (
		    k + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] + wa3[i__ - 2]
		    * cc[(i__ - 1 + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1
		    + 1] + wa3[i__ - 1] * cc[(i__ + (k + (cc_dim3 << 2)) *
		    cc_dim2) * cc_dim1 + 1]) + ti11 * (wa1[i__ - 2] * cc[(i__
		    + (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1] - wa1[
		    i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) * cc_dim2) *
		     cc_dim1 + 1] - (wa4[i__ - 2] * cc[(i__ + (k + cc_dim3 *
		    5) * cc_dim2) * cc_dim1 + 1] - wa4[i__ - 1] * cc[(i__ - 1
		    + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1])) + ti12 * (
		    wa2[i__ - 2] * cc[(i__ + (k + cc_dim3 * 3) * cc_dim2) *
		    cc_dim1 + 1] - wa2[i__ - 1] * cc[(i__ - 1 + (k + cc_dim3 *
		     3) * cc_dim2) * cc_dim1 + 1] - (wa3[i__ - 2] * cc[(i__ +
		    (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1] - wa3[i__
		    - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 2)) * cc_dim2) *
		    cc_dim1 + 1]));
	    ch[(ic - 1 + (k * 5 + 2) * ch_dim2) * ch_dim1 + 1] = cc[(i__ - 1
		    + (k + cc_dim3) * cc_dim2) * cc_dim1 + 1] + tr11 * (wa1[
		    i__ - 2] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) * cc_dim2) *
		     cc_dim1 + 1] + wa1[i__ - 1] * cc[(i__ + (k + (cc_dim3 <<
		    1)) * cc_dim2) * cc_dim1 + 1] + wa4[i__ - 2] * cc[(i__ -
		    1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] + wa4[i__
		    - 1] * cc[(i__ + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 +
		    1]) + tr12 * (wa2[i__ - 2] * cc[(i__ - 1 + (k + cc_dim3 *
		    3) * cc_dim2) * cc_dim1 + 1] + wa2[i__ - 1] * cc[(i__ + (
		    k + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] + wa3[i__ - 2]
		    * cc[(i__ - 1 + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1
		    + 1] + wa3[i__ - 1] * cc[(i__ + (k + (cc_dim3 << 2)) *
		    cc_dim2) * cc_dim1 + 1]) - (ti11 * (wa1[i__ - 2] * cc[(
		    i__ + (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1] -
		    wa1[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) *
		    cc_dim2) * cc_dim1 + 1] - (wa4[i__ - 2] * cc[(i__ + (k +
		    cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] - wa4[i__ - 1] *
		    cc[(i__ - 1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1])
		    ) + ti12 * (wa2[i__ - 2] * cc[(i__ + (k + cc_dim3 * 3) *
		    cc_dim2) * cc_dim1 + 1] - wa2[i__ - 1] * cc[(i__ - 1 + (k
		    + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] - (wa3[i__ - 2] *
		     cc[(i__ + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1]
		    - wa3[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 2)) *
		    cc_dim2) * cc_dim1 + 1])));
	    ch[(i__ + (k * 5 + 3) * ch_dim2) * ch_dim1 + 1] = cc[(i__ + (k +
		    cc_dim3) * cc_dim2) * cc_dim1 + 1] + tr11 * (wa1[i__ - 2]
		    * cc[(i__ + (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1]
		     - wa1[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) *
		    cc_dim2) * cc_dim1 + 1] + (wa4[i__ - 2] * cc[(i__ + (k +
		    cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] - wa4[i__ - 1] *
		    cc[(i__ - 1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1])
		    ) + tr12 * (wa2[i__ - 2] * cc[(i__ + (k + cc_dim3 * 3) *
		    cc_dim2) * cc_dim1 + 1] - wa2[i__ - 1] * cc[(i__ - 1 + (k
		    + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] + (wa3[i__ - 2] *
		     cc[(i__ + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1]
		    - wa3[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 2)) *
		    cc_dim2) * cc_dim1 + 1])) + (ti11 * (wa4[i__ - 2] * cc[(
		    i__ - 1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] +
		    wa4[i__ - 1] * cc[(i__ + (k + cc_dim3 * 5) * cc_dim2) *
		    cc_dim1 + 1] - (wa1[i__ - 2] * cc[(i__ - 1 + (k + (
		    cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1] + wa1[i__ - 1] *
		    cc[(i__ + (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1]))
		     + ti12 * (wa3[i__ - 2] * cc[(i__ - 1 + (k + (cc_dim3 <<
		    2)) * cc_dim2) * cc_dim1 + 1] + wa3[i__ - 1] * cc[(i__ + (
		    k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1] - (wa2[i__
		    - 2] * cc[(i__ - 1 + (k + cc_dim3 * 3) * cc_dim2) *
		    cc_dim1 + 1] + wa2[i__ - 1] * cc[(i__ + (k + cc_dim3 * 3)
		    * cc_dim2) * cc_dim1 + 1])));
	    ch[(ic + (k * 5 + 2) * ch_dim2) * ch_dim1 + 1] = ti11 * (wa4[i__
		    - 2] * cc[(i__ - 1 + (k + cc_dim3 * 5) * cc_dim2) *
		    cc_dim1 + 1] + wa4[i__ - 1] * cc[(i__ + (k + cc_dim3 * 5)
		    * cc_dim2) * cc_dim1 + 1] - (wa1[i__ - 2] * cc[(i__ - 1 +
		    (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1] + wa1[i__
		    - 1] * cc[(i__ + (k + (cc_dim3 << 1)) * cc_dim2) *
		    cc_dim1 + 1])) + ti12 * (wa3[i__ - 2] * cc[(i__ - 1 + (k
		    + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1] + wa3[i__ - 1]
		     * cc[(i__ + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 +
		    1] - (wa2[i__ - 2] * cc[(i__ - 1 + (k + cc_dim3 * 3) *
		    cc_dim2) * cc_dim1 + 1] + wa2[i__ - 1] * cc[(i__ + (k +
		    cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1])) - (cc[(i__ + (k
		    + cc_dim3) * cc_dim2) * cc_dim1 + 1] + tr11 * (wa1[i__ -
		    2] * cc[(i__ + (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1
		    + 1] - wa1[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) *
		     cc_dim2) * cc_dim1 + 1] + (wa4[i__ - 2] * cc[(i__ + (k +
		    cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] - wa4[i__ - 1] *
		    cc[(i__ - 1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1])
		    ) + tr12 * (wa2[i__ - 2] * cc[(i__ + (k + cc_dim3 * 3) *
		    cc_dim2) * cc_dim1 + 1] - wa2[i__ - 1] * cc[(i__ - 1 + (k
		    + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] + (wa3[i__ - 2] *
		     cc[(i__ + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1]
		    - wa3[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 2)) *
		    cc_dim2) * cc_dim1 + 1])));
	    ch[(i__ - 1 + (k * 5 + 5) * ch_dim2) * ch_dim1 + 1] = cc[(i__ - 1
		    + (k + cc_dim3) * cc_dim2) * cc_dim1 + 1] + tr12 * (wa1[
		    i__ - 2] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) * cc_dim2) *
		     cc_dim1 + 1] + wa1[i__ - 1] * cc[(i__ + (k + (cc_dim3 <<
		    1)) * cc_dim2) * cc_dim1 + 1] + (wa4[i__ - 2] * cc[(i__ -
		    1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] + wa4[i__
		    - 1] * cc[(i__ + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 +
		    1])) + tr11 * (wa2[i__ - 2] * cc[(i__ - 1 + (k + cc_dim3 *
		     3) * cc_dim2) * cc_dim1 + 1] + wa2[i__ - 1] * cc[(i__ + (
		    k + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] + (wa3[i__ - 2]
		     * cc[(i__ - 1 + (k + (cc_dim3 << 2)) * cc_dim2) *
		    cc_dim1 + 1] + wa3[i__ - 1] * cc[(i__ + (k + (cc_dim3 <<
		    2)) * cc_dim2) * cc_dim1 + 1])) + (ti12 * (wa1[i__ - 2] *
		    cc[(i__ + (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1]
		    - wa1[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) *
		    cc_dim2) * cc_dim1 + 1] - (wa4[i__ - 2] * cc[(i__ + (k +
		    cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] - wa4[i__ - 1] *
		    cc[(i__ - 1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1])
		    ) - ti11 * (wa2[i__ - 2] * cc[(i__ + (k + cc_dim3 * 3) *
		    cc_dim2) * cc_dim1 + 1] - wa2[i__ - 1] * cc[(i__ - 1 + (k
		    + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] - (wa3[i__ - 2] *
		     cc[(i__ + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1]
		    - wa3[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 2)) *
		    cc_dim2) * cc_dim1 + 1])));
	    ch[(ic - 1 + (k * 5 + 4) * ch_dim2) * ch_dim1 + 1] = cc[(i__ - 1
		    + (k + cc_dim3) * cc_dim2) * cc_dim1 + 1] + tr12 * (wa1[
		    i__ - 2] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) * cc_dim2) *
		     cc_dim1 + 1] + wa1[i__ - 1] * cc[(i__ + (k + (cc_dim3 <<
		    1)) * cc_dim2) * cc_dim1 + 1] + (wa4[i__ - 2] * cc[(i__ -
		    1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] + wa4[i__
		    - 1] * cc[(i__ + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 +
		    1])) + tr11 * (wa2[i__ - 2] * cc[(i__ - 1 + (k + cc_dim3 *
		     3) * cc_dim2) * cc_dim1 + 1] + wa2[i__ - 1] * cc[(i__ + (
		    k + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] + (wa3[i__ - 2]
		     * cc[(i__ - 1 + (k + (cc_dim3 << 2)) * cc_dim2) *
		    cc_dim1 + 1] + wa3[i__ - 1] * cc[(i__ + (k + (cc_dim3 <<
		    2)) * cc_dim2) * cc_dim1 + 1])) - (ti12 * (wa1[i__ - 2] *
		    cc[(i__ + (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1]
		    - wa1[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) *
		    cc_dim2) * cc_dim1 + 1] - (wa4[i__ - 2] * cc[(i__ + (k +
		    cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] - wa4[i__ - 1] *
		    cc[(i__ - 1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1])
		    ) - ti11 * (wa2[i__ - 2] * cc[(i__ + (k + cc_dim3 * 3) *
		    cc_dim2) * cc_dim1 + 1] - wa2[i__ - 1] * cc[(i__ - 1 + (k
		    + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] - (wa3[i__ - 2] *
		     cc[(i__ + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1]
		    - wa3[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 2)) *
		    cc_dim2) * cc_dim1 + 1])));
	    ch[(i__ + (k * 5 + 5) * ch_dim2) * ch_dim1 + 1] = cc[(i__ + (k +
		    cc_dim3) * cc_dim2) * cc_dim1 + 1] + tr12 * (wa1[i__ - 2]
		    * cc[(i__ + (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1]
		     - wa1[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) *
		    cc_dim2) * cc_dim1 + 1] + (wa4[i__ - 2] * cc[(i__ + (k +
		    cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] - wa4[i__ - 1] *
		    cc[(i__ - 1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1])
		    ) + tr11 * (wa2[i__ - 2] * cc[(i__ + (k + cc_dim3 * 3) *
		    cc_dim2) * cc_dim1 + 1] - wa2[i__ - 1] * cc[(i__ - 1 + (k
		    + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] + (wa3[i__ - 2] *
		     cc[(i__ + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1]
		    - wa3[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 2)) *
		    cc_dim2) * cc_dim1 + 1])) + (ti12 * (wa4[i__ - 2] * cc[(
		    i__ - 1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] +
		    wa4[i__ - 1] * cc[(i__ + (k + cc_dim3 * 5) * cc_dim2) *
		    cc_dim1 + 1] - (wa1[i__ - 2] * cc[(i__ - 1 + (k + (
		    cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1] + wa1[i__ - 1] *
		    cc[(i__ + (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1]))
		     - ti11 * (wa3[i__ - 2] * cc[(i__ - 1 + (k + (cc_dim3 <<
		    2)) * cc_dim2) * cc_dim1 + 1] + wa3[i__ - 1] * cc[(i__ + (
		    k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1] - (wa2[i__
		    - 2] * cc[(i__ - 1 + (k + cc_dim3 * 3) * cc_dim2) *
		    cc_dim1 + 1] + wa2[i__ - 1] * cc[(i__ + (k + cc_dim3 * 3)
		    * cc_dim2) * cc_dim1 + 1])));
	    ch[(ic + (k * 5 + 4) * ch_dim2) * ch_dim1 + 1] = ti12 * (wa4[i__
		    - 2] * cc[(i__ - 1 + (k + cc_dim3 * 5) * cc_dim2) *
		    cc_dim1 + 1] + wa4[i__ - 1] * cc[(i__ + (k + cc_dim3 * 5)
		    * cc_dim2) * cc_dim1 + 1] - (wa1[i__ - 2] * cc[(i__ - 1 +
		    (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1] + wa1[i__
		    - 1] * cc[(i__ + (k + (cc_dim3 << 1)) * cc_dim2) *
		    cc_dim1 + 1])) - ti11 * (wa3[i__ - 2] * cc[(i__ - 1 + (k
		    + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1] + wa3[i__ - 1]
		     * cc[(i__ + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 +
		    1] - (wa2[i__ - 2] * cc[(i__ - 1 + (k + cc_dim3 * 3) *
		    cc_dim2) * cc_dim1 + 1] + wa2[i__ - 1] * cc[(i__ + (k +
		    cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1])) - (cc[(i__ + (k
		    + cc_dim3) * cc_dim2) * cc_dim1 + 1] + tr12 * (wa1[i__ -
		    2] * cc[(i__ + (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1
		    + 1] - wa1[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) *
		     cc_dim2) * cc_dim1 + 1] + (wa4[i__ - 2] * cc[(i__ + (k +
		    cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] - wa4[i__ - 1] *
		    cc[(i__ - 1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1])
		    ) + tr11 * (wa2[i__ - 2] * cc[(i__ + (k + cc_dim3 * 3) *
		    cc_dim2) * cc_dim1 + 1] - wa2[i__ - 1] * cc[(i__ - 1 + (k
		    + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] + (wa3[i__ - 2] *
		     cc[(i__ + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1]
		    - wa3[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 2)) *
		    cc_dim2) * cc_dim1 + 1])));
/* L102: */
	}
/* L103: */
    }
    return 0;
}